

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_userid_filter_module.c
# Opt level: O1

ngx_int_t ngx_http_userid_create_uid
                    (ngx_http_request_t *r,ngx_http_userid_ctx_t *ctx,ngx_http_userid_conf_t *conf)

{
  u_char *puVar1;
  ngx_log_t *log;
  long lVar2;
  ngx_connection_t *c;
  sockaddr *psVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  ngx_http_variable_value_t *pnVar7;
  ngx_int_t nVar8;
  
  if (ctx->uid_set[3] != 0) {
    return 0;
  }
  if (ctx->uid_got[3] != 0) {
    pnVar7 = ngx_http_get_indexed_variable(r,ngx_http_userid_reset_index);
    if (((*(uint *)pnVar7 & 0xfffffff) == 0) ||
       (((*(uint *)pnVar7 & 0xfffffff) == 1 && (*pnVar7->data == '0')))) {
      if (conf->mark == '\0') {
        return 0;
      }
      if (((0x17 < (ctx->cookie).len) && (puVar1 = (ctx->cookie).data, puVar1[0x16] == conf->mark))
         && (puVar1[0x17] == '=')) {
        return 0;
      }
      uVar4 = *(undefined8 *)(ctx->uid_got + 2);
      *(undefined8 *)ctx->uid_set = *(undefined8 *)ctx->uid_got;
      *(undefined8 *)(ctx->uid_set + 2) = uVar4;
      return 0;
    }
    ctx->reset = 1;
    if (((((undefined1  [16])*pnVar7 & (undefined1  [16])0xfffffff) == (undefined1  [16])0x3) &&
        (iVar5 = strncmp((char *)pnVar7->data,"log",3), iVar5 == 0)) &&
       (log = r->connection->log, 5 < log->log_level)) {
      ngx_log_error_core(6,log,0,"userid cookie \"%V=%08XD%08XD%08XD%08XD\" was reset",&conf->name,
                         (ulong)ctx->uid_got[0],(ulong)ctx->uid_got[1],(ulong)ctx->uid_got[2],
                         (ulong)ctx->uid_got[3]);
    }
  }
  lVar2 = conf->service;
  uVar6 = (uint)lVar2;
  if (conf->enable == 2) {
    if (lVar2 == -1) {
      uVar6 = 0;
    }
    ctx->uid_set[0] = uVar6;
    ctx->uid_set[1] = (uint32_t)ngx_cached_time->sec;
    ctx->uid_set[2] = start_value;
    ctx->uid_set[3] = sequencer_v1;
    sequencer_v1 = sequencer_v1 + 0x100;
    return 0;
  }
  if (lVar2 == -1) {
    c = r->connection;
    nVar8 = ngx_connection_local_sockaddr(c,(ngx_str_t *)0x0,0);
    if (nVar8 != 0) {
      return -1;
    }
    psVar3 = c->local_sockaddr;
    if (psVar3->sa_family == 10) {
      *(char *)ctx->uid_set = psVar3[1].sa_data[2];
      *(char *)((long)ctx->uid_set + 1) = psVar3[1].sa_data[3];
      *(char *)((long)ctx->uid_set + 2) = psVar3[1].sa_data[4];
      *(char *)((long)ctx->uid_set + 3) = psVar3[1].sa_data[5];
    }
    else {
      ctx->uid_set[0] = *(uint32_t *)(psVar3->sa_data + 2);
    }
  }
  else {
    ctx->uid_set[0] =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  }
  uVar6 = (uint)ngx_cached_time->sec;
  ctx->uid_set[1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  ctx->uid_set[2] =
       start_value >> 0x18 | (start_value & 0xff0000) >> 8 | (start_value & 0xff00) << 8 |
       start_value << 0x18;
  ctx->uid_set[3] =
       sequencer_v2 >> 0x18 | (sequencer_v2 & 0xff0000) >> 8 | (sequencer_v2 & 0xff00) << 8 |
       sequencer_v2 << 0x18;
  uVar6 = sequencer_v2 + 0x100;
  sequencer_v2 = 0x3030302;
  if (0x3030302 < uVar6) {
    sequencer_v2 = uVar6;
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_userid_create_uid(ngx_http_request_t *r, ngx_http_userid_ctx_t *ctx,
    ngx_http_userid_conf_t *conf)
{
    ngx_connection_t           *c;
    struct sockaddr_in         *sin;
    ngx_http_variable_value_t  *vv;
#if (NGX_HAVE_INET6)
    u_char                     *p;
    struct sockaddr_in6        *sin6;
#endif

    if (ctx->uid_set[3] != 0) {
        return NGX_OK;
    }

    if (ctx->uid_got[3] != 0) {

        vv = ngx_http_get_indexed_variable(r, ngx_http_userid_reset_index);

        if (vv->len == 0 || (vv->len == 1 && vv->data[0] == '0')) {

            if (conf->mark == '\0'
                || (ctx->cookie.len > 23
                    && ctx->cookie.data[22] == conf->mark
                    && ctx->cookie.data[23] == '='))
            {
                return NGX_OK;
            }

            ctx->uid_set[0] = ctx->uid_got[0];
            ctx->uid_set[1] = ctx->uid_got[1];
            ctx->uid_set[2] = ctx->uid_got[2];
            ctx->uid_set[3] = ctx->uid_got[3];

            return NGX_OK;

        } else {
            ctx->reset = 1;

            if (vv->len == 3 && ngx_strncmp(vv->data, "log", 3) == 0) {
                ngx_log_error(NGX_LOG_NOTICE, r->connection->log, 0,
                        "userid cookie \"%V=%08XD%08XD%08XD%08XD\" was reset",
                        &conf->name, ctx->uid_got[0], ctx->uid_got[1],
                        ctx->uid_got[2], ctx->uid_got[3]);
            }
        }
    }

    /*
     * TODO: in the threaded mode the sequencers should be in TLS and their
     * ranges should be divided between threads
     */

    if (conf->enable == NGX_HTTP_USERID_V1) {
        if (conf->service == NGX_CONF_UNSET) {
            ctx->uid_set[0] = 0;
        } else {
            ctx->uid_set[0] = conf->service;
        }
        ctx->uid_set[1] = (uint32_t) ngx_time();
        ctx->uid_set[2] = start_value;
        ctx->uid_set[3] = sequencer_v1;
        sequencer_v1 += 0x100;

    } else {
        if (conf->service == NGX_CONF_UNSET) {

            c = r->connection;

            if (ngx_connection_local_sockaddr(c, NULL, 0) != NGX_OK) {
                return NGX_ERROR;
            }

            switch (c->local_sockaddr->sa_family) {

#if (NGX_HAVE_INET6)
            case AF_INET6:
                sin6 = (struct sockaddr_in6 *) c->local_sockaddr;

                p = (u_char *) &ctx->uid_set[0];

                *p++ = sin6->sin6_addr.s6_addr[12];
                *p++ = sin6->sin6_addr.s6_addr[13];
                *p++ = sin6->sin6_addr.s6_addr[14];
                *p = sin6->sin6_addr.s6_addr[15];

                break;
#endif
            default: /* AF_INET */
                sin = (struct sockaddr_in *) c->local_sockaddr;
                ctx->uid_set[0] = sin->sin_addr.s_addr;
                break;
            }

        } else {
            ctx->uid_set[0] = htonl(conf->service);
        }

        ctx->uid_set[1] = htonl((uint32_t) ngx_time());
        ctx->uid_set[2] = htonl(start_value);
        ctx->uid_set[3] = htonl(sequencer_v2);
        sequencer_v2 += 0x100;
        if (sequencer_v2 < 0x03030302) {
            sequencer_v2 = 0x03030302;
        }
    }

    return NGX_OK;
}